

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O3

void frame(void)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  int extraout_EAX;
  int *piVar4;
  timeval tv;
  fd_set fds;
  timeval local_118;
  ulong local_108 [12];
  fd_set local_a8;
  
  do {
    while( true ) {
      local_a8.fds_bits[0] = 0;
      local_a8.fds_bits[1] = 0;
      local_a8.fds_bits[2] = 0;
      local_a8.fds_bits[3] = 0;
      local_a8.fds_bits[4] = 0;
      local_a8.fds_bits[5] = 0;
      local_a8.fds_bits[6] = 0;
      local_a8.fds_bits[7] = 0;
      local_a8.fds_bits[8] = 0;
      local_a8.fds_bits[9] = 0;
      local_a8.fds_bits[10] = 0;
      local_a8.fds_bits[0xb] = 0;
      local_a8.fds_bits[0xc] = 0;
      local_a8.fds_bits[0xd] = 0;
      local_a8.fds_bits[0xe] = 0;
      local_a8.fds_bits[0xf] = 0;
      iVar3 = fd + 0x3f;
      if (-1 < fd) {
        iVar3 = fd;
      }
      local_a8.fds_bits[iVar3 >> 6] =
           local_a8.fds_bits[iVar3 >> 6] | 1L << ((byte)(fd % 0x40) & 0x3f);
      local_118.tv_sec = 2;
      local_118.tv_usec = 0;
      iVar3 = select(fd + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_118);
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
      if (*piVar4 != 4) {
        errno_exit("select");
LAB_00117580:
        if ((uint)local_108[0] < n_buffers) {
          puVar1 = (uchar *)buffers[local_108[0] & 0xffffffff].start;
          if (Webcam::isStreamMode == true) {
            sVar2 = buffers[local_108[0] & 0xffffffff].length;
            iVar3 = pthread_mutex_lock((pthread_mutex_t *)&imgLock);
            if (iVar3 != 0) goto LAB_00117683;
            imgBuffer[1 - (long)readyImgPos].data = puVar1;
            imgBuffer[1 - (long)readyImgPos].size = (int)sVar2;
            readyImgPos = 1 - readyImgPos;
            pthread_mutex_unlock((pthread_mutex_t *)&imgLock);
            puVar1 = imgBuffer[0].data;
          }
          imgBuffer[0].data = puVar1;
          iVar3 = xioctl(fd,-0x3fa7a9f1,local_108);
          if (iVar3 != -1) {
            return;
          }
          errno_exit("VIDIOC_QBUF");
          iVar3 = extraout_EAX;
LAB_00117683:
          std::__throw_system_error(iVar3);
        }
        goto LAB_00117658;
      }
    }
    if (iVar3 == 0) {
      frame();
      goto LAB_0011764c;
    }
    read_frame()::count = read_frame()::count + 1;
    printf("%d\n");
    local_108[1] = 0;
    local_108[6] = 0;
    local_108[2] = 0;
    local_108[3] = 0;
    local_108[4] = 0;
    local_108[5] = 0;
    local_108[8] = 0;
    local_108[9] = 0;
    local_108[10] = 0;
    local_108[0] = 0x100000000;
    local_108[7] = 0x100000000;
    iVar3 = xioctl(fd,-0x3fa7a9ef,local_108);
    if (iVar3 != -1) goto LAB_00117580;
    piVar4 = __errno_location();
    if (*piVar4 != 0xb) {
LAB_0011764c:
      errno_exit("VIDIOC_DQBUF");
LAB_00117658:
      __assert_fail("buf.index < n_buffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/usbcam.cpp"
                    ,0x8d,"int read_frame()");
    }
  } while( true );
}

Assistant:

static void
frame                        (void)
{
    for (;;) {
        fd_set fds;
        struct timeval tv;
        int r;

        FD_ZERO (&fds);
        FD_SET (fd, &fds);

        /* Timeout. */
        tv.tv_sec = 2;
        tv.tv_usec = 0;

        r = select (fd + 1, &fds, NULL, NULL, &tv);

        if (-1 == r) {
            if (EINTR == errno)
                continue;

            errno_exit ("select");
        }

        if (0 == r) {
            fprintf (stderr, "select timeout\n");
            errno_exit (EXIT_FAILURE);
        }

        if (read_frame ())
            break;

        /* EAGAIN - continue select loop. */
    }
}